

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall
CConnman::OpenNetworkConnection
          (CConnman *this,CAddress *addrConnect,bool fCountFailure,CSemaphoreGrant *grant_outbound,
          char *pszDest,ConnectionType conn_type,bool use_v2transport)

{
  uint *puVar1;
  CAddress addrConnect_00;
  bool bVar2;
  bool bVar3;
  Network NVar4;
  CNode *pCVar5;
  long in_FS_OFFSET;
  CNode *pnode;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock82;
  undefined8 in_stack_ffffffffffffff58;
  value_type in_stack_ffffffffffffff68;
  CNode *this_00;
  CNetAddr in_stack_ffffffffffffff70;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (conn_type == INBOUND) {
    __assert_fail("conn_type != ConnectionType::INBOUND",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ,0xb6f,
                  "void CConnman::OpenNetworkConnection(const CAddress &, bool, CSemaphoreGrant &&, const char *, ConnectionType, bool)"
                 );
  }
  bVar2 = CThreadInterrupt::operator_cast_to_bool(&this->interruptNet);
  if ((!bVar2) && (((this->fNetworkActive)._M_base._M_i & 1U) != 0)) {
    if (pszDest == (char *)0x0) {
      if (this->m_banman == (BanMan *)0x0) {
        bVar2 = false;
      }
      else {
        bVar3 = BanMan::IsDiscouraged(this->m_banman,(CNetAddr *)addrConnect);
        bVar2 = true;
        if (!bVar3) {
          bVar2 = BanMan::IsBanned(this->m_banman,(CNetAddr *)addrConnect);
        }
      }
      bVar3 = IsLocal(&addrConnect->super_CService);
      if ((bVar3 || bVar2 != false) || (bVar2 = AlreadyConnectedToAddress(this,addrConnect), bVar2))
      goto LAB_0017ad25;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,pszDest,(allocator<char> *)&stack0xffffffffffffff68);
      pCVar5 = FindNode(this,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (pCVar5 != (CNode *)0x0) goto LAB_0017ad25;
    }
    CAddress::CAddress((CAddress *)&stack0xffffffffffffff70,addrConnect);
    addrConnect_00.super_CService.super_CNetAddr.m_addr._union._8_8_ = grant_outbound;
    addrConnect_00.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         (char *)in_stack_ffffffffffffff58;
    addrConnect_00.super_CService.super_CNetAddr.m_addr._16_8_ = in_stack_ffffffffffffff68;
    addrConnect_00._24_32_ = in_stack_ffffffffffffff70;
    pCVar5 = ConnectNode(this,addrConnect_00,(char *)&stack0xffffffffffffff70,SUB81(pszDest,0),
                         (uint)fCountFailure,SUB41(conn_type,0));
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&stack0xffffffffffffff70);
    if (pCVar5 != (CNode *)0x0) {
      this_00 = pCVar5;
      CSemaphoreGrant::operator=(&pCVar5->grantOutbound,grant_outbound);
      (**this->m_msgproc->_vptr_NetEventsInterface)
                (this->m_msgproc,pCVar5,(this->nLocalServices)._M_i);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_58,&this->m_nodes_mutex
                 ,"m_nodes_mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                 ,0xb8a,false);
      std::vector<CNode_*,_std::allocator<CNode_*>_>::push_back
                (&this->m_nodes,(value_type *)&stack0xffffffffffffff68);
      bVar2 = CNode::IsManualOrFullOutboundConn(this_00);
      if (bVar2) {
        NVar4 = CNetAddr::GetNetwork((CNetAddr *)&this_00->addr);
        puVar1 = (this->m_network_conn_counts)._M_elems + NVar4;
        *puVar1 = *puVar1 + 1;
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&local_58);
    }
  }
LAB_0017ad25:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::OpenNetworkConnection(const CAddress& addrConnect, bool fCountFailure, CSemaphoreGrant&& grant_outbound, const char *pszDest, ConnectionType conn_type, bool use_v2transport)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    assert(conn_type != ConnectionType::INBOUND);

    //
    // Initiate outbound network connection
    //
    if (interruptNet) {
        return;
    }
    if (!fNetworkActive) {
        return;
    }
    if (!pszDest) {
        bool banned_or_discouraged = m_banman && (m_banman->IsDiscouraged(addrConnect) || m_banman->IsBanned(addrConnect));
        if (IsLocal(addrConnect) || banned_or_discouraged || AlreadyConnectedToAddress(addrConnect)) {
            return;
        }
    } else if (FindNode(std::string(pszDest)))
        return;

    CNode* pnode = ConnectNode(addrConnect, pszDest, fCountFailure, conn_type, use_v2transport);

    if (!pnode)
        return;
    pnode->grantOutbound = std::move(grant_outbound);

    m_msgproc->InitializeNode(*pnode, nLocalServices);
    {
        LOCK(m_nodes_mutex);
        m_nodes.push_back(pnode);

        // update connection count by network
        if (pnode->IsManualOrFullOutboundConn()) ++m_network_conn_counts[pnode->addr.GetNetwork()];
    }
}